

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  size_t __size;
  _Self __tmp;
  long *plVar6;
  ulong uVar7;
  char local_488 [8];
  char r_buf [1024];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  string b;
  string serial_port;
  
  getComList_abi_cxx11_();
  b.field_2._8_8_ = &serial_port._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&b.field_2 + 8),"");
  l.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)&b._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &l.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size,"USB","");
  if ((char *)r_buf._1016_8_ == r_buf + 0x3f8) {
LAB_0010259e:
    lVar3 = 0x2b;
    pcVar5 = "not found right serial port,please check!!!";
  }
  else {
    iVar1 = 0;
    plVar6 = (long *)r_buf._1016_8_;
    do {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)plVar6[2],plVar6[3]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      lVar3 = std::__cxx11::string::find
                        ((char *)(plVar6 + 2),
                         l.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size,0);
      if (lVar3 != -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"found\n",6);
        std::__cxx11::string::_M_assign((string *)(b.field_2._M_local_buf + 8));
        iVar1 = iVar1 + 1;
      }
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)(r_buf + 0x3f8));
    if (iVar1 == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"find serial port, OK!!!",0x17);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"serial_port == ",0xf);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)b.field_2._8_8_,
                          (long)serial_port._M_dataplus._M_p);
      goto LAB_001025b9;
    }
    if (iVar1 < 2) goto LAB_0010259e;
    lVar3 = 0x35;
    pcVar5 = "find more than one serial port,please choose check!!!";
  }
  poVar4 = (ostream *)&std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar3);
LAB_001025b9:
  std::endl<char,std::char_traits<char>>(poVar4);
  bzero(local_488,0x400);
  IMU_JY61::fd = IMU_JY61::uart_open(IMU_JY61::fd,(char *)b.field_2._8_8_);
  if (IMU_JY61::fd == -1) {
    pcVar5 = "uart_open error\n";
    __size = 0x10;
  }
  else {
    iVar1 = IMU_JY61::uart_set(IMU_JY61::fd,0x1c200,8,'N',1);
    if (iVar1 == -1) {
      pcVar5 = "uart set failed!\n";
      __size = 0x11;
    }
    else {
      IMU_JY61::getTime();
      while( true ) {
        uVar2 = IMU_JY61::recv_data(IMU_JY61::fd,local_488,0x2c);
        if (uVar2 == 0xffffffff) break;
        if (0 < (int)uVar2) {
          uVar7 = 0;
          do {
            IMU_JY61::ParseData(local_488[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar2 != uVar7);
        }
        usleep(1000);
      }
      pcVar5 = "uart read failed!\n";
      __size = 0x12;
    }
  }
  fwrite(pcVar5,__size,1,_stderr);
  exit(1);
}

Assistant:

int main(void)
{
    //qxiaofan added
    //自动识别串口
    list<string> l = getComList();

    list<string>::iterator it = l.begin();

    std::string serial_port= "";
    std::string b = "USB";
    string::size_type idx;

    int success_num = 0;

    while (it != l.end()) {
        cout << *it << endl;

        idx = it->find(b);
        if(idx != string::npos)
        {
            cout<<"found\n";
            success_num++;
            serial_port = *it;
        }
        it++;
    }

    if(success_num == 1)
    {
        std::cout<<"find serial port, OK!!!"<<std::endl;
        std::cout<<"serial_port == "<<serial_port<<std::endl;
    }

    if(success_num > 1)
    {
        std::cout<<"find more than one serial port,please choose check!!!"<<std::endl;
    }

    if(success_num < 1)
    {
        std::cout<<"not found right serial port,please check!!!"<<std::endl;
    }
    //qxiaofan ended

    char r_buf[1024];
    bzero(r_buf,1024);

    //src
    //fd = uart_open(fd,"/dev/ttyUSB1");/*串口号/dev/ttySn,USB口号/dev/ttyUSBn */

    fd = uart_open(fd,serial_port.c_str());

    if(fd == -1)
    {
        fprintf(stderr,"uart_open error\n");
        exit(EXIT_FAILURE);
    }

    if(uart_set(fd,BAUD,8,'N',1) == -1)
    {
        fprintf(stderr,"uart set failed!\n");
        exit(EXIT_FAILURE);
    }

    //src
	//FILE *fp;
	//fp = fopen("Record.txt","w");

	long time_base = getTime();
    while(1)
    {
        ret = recv_data(fd,r_buf,44);
        if(ret == -1)
        {
            fprintf(stderr,"uart read failed!\n");
            exit(EXIT_FAILURE);
        }
		for (int i=0;i<ret;i++) {
		    //fprintf(fp,"%2X ",r_buf[i]);
		    //std::cout<<"r_buf["<<i<<"] == "<<r_buf[i]<<std::endl;
		    ParseData(r_buf[i]);
		}
        usleep(1000);
    }

    ret = uart_close(fd);
    if(ret == -1)
    {
        fprintf(stderr,"uart_close error\n");
        exit(EXIT_FAILURE);
    }

    exit(EXIT_SUCCESS);
}